

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

Header * __thiscall Imf_3_4::Header::operator=(Header *this,Header *other)

{
  Header *in_RSI;
  Header *in_RDI;
  Header *in_stack_00000078;
  Header *in_stack_00000080;
  
  if (in_RDI != in_RSI) {
    std::
    swap<Imf_3_4::Name,Imf_3_4::Attribute*,std::less<Imf_3_4::Name>,std::allocator<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>>
              (&in_RSI->_map,&in_RDI->_map);
    anon_unknown_1::copyCompressionRecord(in_stack_00000080,in_stack_00000078);
    in_RDI->_readsNothing = (bool)(in_RSI->_readsNothing & 1);
  }
  return in_RDI;
}

Assistant:

Header&
Header::operator= (Header&& other)
{
    if (this != &other)
    {
        std::swap (_map, other._map);
        // don't have to move or anything as it's pod types
        copyCompressionRecord (this, &other);
        _readsNothing = other._readsNothing;
    }

    return *this;
}